

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

void __thiscall sf::Font::cleanup(Font *this,EVP_PKEY_CTX *ctx)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  if ((this->m_refCount != (int *)0x0) &&
     (*this->m_refCount = *this->m_refCount + -1, *this->m_refCount == 0)) {
    if (this->m_refCount != (int *)0x0) {
      operator_delete(this->m_refCount);
    }
    if (this->m_stroker != (void *)0x0) {
      FT_Stroker_Done(this->m_stroker);
    }
    if (this->m_face != (void *)0x0) {
      FT_Done_Face(this->m_face);
    }
    if ((this->m_streamRec != (void *)0x0) && (this->m_streamRec != (void *)0x0)) {
      operator_delete(this->m_streamRec);
    }
    if (this->m_library != (void *)0x0) {
      FT_Done_FreeType(this->m_library);
    }
  }
  this->m_library = (void *)0x0;
  this->m_face = (void *)0x0;
  this->m_stroker = (void *)0x0;
  this->m_streamRec = (void *)0x0;
  this->m_refCount = (int *)0x0;
  std::
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::clear((map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
           *)0x293b78);
  memset(&stack0xffffffffffffffe0,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x293b93);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
            (in_stack_ffffffffffffffe0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void Font::cleanup()
{
    // Check if we must destroy the FreeType pointers
    if (m_refCount)
    {
        // Decrease the reference counter
        (*m_refCount)--;

        // Free the resources only if we are the last owner
        if (*m_refCount == 0)
        {
            // Delete the reference counter
            delete m_refCount;

            // Destroy the stroker
            if (m_stroker)
                FT_Stroker_Done(static_cast<FT_Stroker>(m_stroker));

            // Destroy the font face
            if (m_face)
                FT_Done_Face(static_cast<FT_Face>(m_face));

            // Destroy the stream rec instance, if any (must be done after FT_Done_Face!)
            if (m_streamRec)
                delete static_cast<FT_StreamRec*>(m_streamRec);

            // Close the library
            if (m_library)
                FT_Done_FreeType(static_cast<FT_Library>(m_library));
        }
    }

    // Reset members
    m_library   = NULL;
    m_face      = NULL;
    m_stroker   = NULL;
    m_streamRec = NULL;
    m_refCount  = NULL;
    m_pages.clear();
    std::vector<Uint8>().swap(m_pixelBuffer);
}